

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O2

Vec_Int_t *
findNewMonotone(Aig_Man_t *pAig,aigPoIndices *aigPoIndicesArg,
               monotoneVectorsStruct *monotoneVectorArg)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Aig_Man_t *p;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj;
  Vec_Int_t *pVVar6;
  Aig_Man_t *pAVar7;
  int i;
  int poMarker;
  Pdr_Par_t Pars;
  
  uVar1 = aigPoIndicesArg->attrPendingSignalIndex;
  iVar2 = aigPoIndicesArg->attrHintSingalBeginningMarker;
  pAVar7 = pAig;
  p = createMonotoneTester(pAig,aigPoIndicesArg,monotoneVectorArg,&poMarker);
  iVar3 = pAig->nRegs;
  iVar4 = pAig->nObjs[3];
  p_00 = Vec_IntAlloc((int)pAVar7);
  printf("\nSaig_ManPoNum(pAigNew) = %d, poMarker = %d\n",(ulong)(uint)p->nTruePos,
         (ulong)(uint)poMarker);
  for (i = poMarker; i < p->nTruePos; i = i + 1) {
    pObj = Aig_ManCo(p,i);
    Aig_ObjChild0Flip(pObj);
    Pdr_ManSetDefaultParams(&Pars);
    Pars.fVerbose = 0;
    iVar5 = Pdr_ManSolve(p,&Pars);
    if (iVar5 == 1) {
      printf("\ni = %d, RetValue = %d : %s (Frame %d)\n",
             (ulong)(uint)(i + ((iVar3 + iVar2) - iVar4)),1,"Property Proved",0xffffffffffffffff);
      Vec_IntPush(p_00,~uVar1 + iVar2 + i);
    }
    Aig_ObjChild0Flip(pObj);
  }
  pVVar6 = (Vec_Int_t *)0x0;
  if (0 < p_00->nSize) {
    pVVar6 = p_00;
  }
  return pVVar6;
}

Assistant:

Vec_Int_t *findNewMonotone( Aig_Man_t *pAig, struct aigPoIndices *aigPoIndicesArg, struct monotoneVectorsStruct *monotoneVectorArg )
{
	Aig_Man_t *pAigNew;
	Aig_Obj_t *pObjTargetPo;
	int poMarker, oldPoNum;
	int i, RetValue;
	Pdr_Par_t Pars, * pPars = &Pars;
	Abc_Cex_t * pCex = NULL;
	Vec_Int_t *vMonotoneIndex;

	int pendingSignalIndexLocal = aigPoIndicesArg->attrPendingSignalIndex;
	int hintSingalBeginningMarkerLocal = aigPoIndicesArg->attrHintSingalBeginningMarker;
	//int hintSingalEndMarkerLocal = aigPoIndicesArg->attrHintSingalEndMarker;

	//Vec_Int_t *vKnownMonotoneLocal = monotoneVectorArg->attrKnownMonotone;
	//Vec_Int_t *vCandMonotoneLocal = monotoneVectorArg->attrCandMonotone;
	//Vec_Int_t *vHintMonotoneLocal = monotoneVectorArg->attrHintMonotone;

	pAigNew = createMonotoneTester(pAig, aigPoIndicesArg, monotoneVectorArg, &poMarker );
	oldPoNum = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);

	vMonotoneIndex = Vec_IntAlloc(0);
	printf("\nSaig_ManPoNum(pAigNew) = %d, poMarker = %d\n", Saig_ManPoNum(pAigNew), poMarker);
	for( i=poMarker; i<Saig_ManPoNum(pAigNew); i++ )
	{
		pObjTargetPo = Aig_ManCo( pAigNew, i );
		Aig_ObjChild0Flip( pObjTargetPo );

		Pdr_ManSetDefaultParams( pPars );
		pCex = NULL;
		pPars->fVerbose = 0;
		//pPars->iOutput = i;
		//RetValue = Pdr_ManSolve( pAigNew, pPars, &pCex );	
		RetValue = Pdr_ManSolve( pAigNew, pPars );	
		if( RetValue == 1 )
		{
			printf("\ni = %d, RetValue = %d : %s (Frame %d)\n", i - oldPoNum + hintSingalBeginningMarkerLocal, RetValue, "Property Proved", pCex? (pCex)->iFrame : -1 );
			Vec_IntPush( vMonotoneIndex, i - (pendingSignalIndexLocal + 1) + hintSingalBeginningMarkerLocal);
		}
		Aig_ObjChild0Flip( pObjTargetPo );
	}
	
	if( Vec_IntSize( vMonotoneIndex ) > 0 )
		return vMonotoneIndex;
	else
		return NULL;
}